

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

void vkt::texture::anon_unknown_0::populateTextureMipmappingTests
               (TestCaseGroup *textureMipmappingTests)

{
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *pvVar1;
  CoordType CVar2;
  TestContext *testCtx;
  char *pcVar3;
  _func_int **__s;
  _func_int **__s_00;
  size_t sVar4;
  long lVar5;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *pTVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance> *pTVar9;
  int iVar10;
  anon_struct_16_2_3f8b7511 *paVar11;
  char *__end_1;
  long lVar12;
  int *piVar13;
  char *__end;
  bool bVar14;
  Texture2DMipmapTestCaseParameters testParameters;
  ostringstream name;
  string local_2e8;
  TestContext *local_2c8;
  allocator<char> local_2b9;
  TestNode *local_2b8;
  TestNode *local_2b0;
  undefined1 local_2a8 [32];
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> local_288;
  undefined8 local_270;
  CoordType local_268;
  int iStack_264;
  char *pcStack_260;
  _func_int **local_258;
  TestNode *local_250;
  TestNode *local_248;
  TestNode *local_240;
  TestNode *local_238;
  TestNode *local_230;
  TestNode *local_228;
  TestNode *local_220;
  long *local_218 [2];
  long local_208 [2];
  TestNode *local_1f8;
  TestNode *local_1f0;
  string local_1e8;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *local_1c8;
  TestNode *local_1c0;
  anon_struct_16_2_3f8b7511 *local_1b8;
  ParameterType local_1b0;
  ios_base local_140 [264];
  TestNode *local_38;
  
  testCtx = (textureMipmappingTests->super_TestNode).m_testCtx;
  local_38 = &textureMipmappingTests->super_TestNode;
  local_230 = (TestNode *)operator_new(0x70);
  local_2c8 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_230,testCtx,"2d","2D Mipmap Filtering");
  local_238 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_238,local_2c8,"bias","User-supplied bias value");
  local_1c0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1c0,local_2c8,"min_lod","Lod control: min lod");
  local_2b8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_2b8,local_2c8,"max_lod","Lod control: max lod");
  local_2b0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_2b0,local_2c8,"base_level","Base level");
  local_248 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_248,local_2c8,"max_level","Max level");
  lVar12 = 0;
  do {
    local_1f0 = (TestNode *)operator_new(0x70);
    local_250 = (TestNode *)lVar12;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1f0,local_2c8,
               populateTextureMipmappingTests::coordTypes[lVar12].name,
               populateTextureMipmappingTests::coordTypes[lVar12].desc);
    CVar2 = populateTextureMipmappingTests::coordTypes[lVar12].type;
    lVar12 = 0;
    do {
      lVar5 = 0;
      local_240 = (TestNode *)lVar12;
      do {
        paVar11 = populateTextureMipmappingTests::wrapModes + lVar5;
        pTVar7 = (TestNode *)&populateTextureMipmappingTests::tex2DSizes[0].height;
        local_220 = (TestNode *)0x0;
        local_228 = (TestNode *)lVar5;
        local_1b8 = paVar11;
        do {
          util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                    ((Texture2DTestCaseParameters *)local_2a8);
          pcStack_260 = (char *)0x0;
          local_2a8._8_4_ = populateTextureMipmappingTests::minFilterModes[lVar12].mode;
          local_2a8._16_4_ = paVar11->mode;
          local_2a8._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
          local_270 = *(undefined8 *)
                       ((long)&pTVar7[-1].m_children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.sampleCount = 0;
          local_2a8._20_4_ = local_2a8._16_4_;
          local_268 = CVar2;
          if (local_288.
              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_288.
              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
            _M_realloc_insert<vkt::texture::util::Program>
                      (&local_288,
                       (iterator)
                       local_288.
                       super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Program *)&local_1b0);
          }
          else {
            *local_288.
             super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
             ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT;
            local_288.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_288.
                 super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          pcVar3 = populateTextureMipmappingTests::minFilterModes[lVar12].name;
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)&local_2e8 +
                            (int)*(undefined8 *)
                                  (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                            super_Texture2DTestCaseParameters.
                                            super_TextureCommonTestCaseParameters.texCoordPrecision,
                                            local_1b0.super_Texture3DTestCaseParameters.
                                            super_Texture2DTestCaseParameters.
                                            super_TextureCommonTestCaseParameters.sampleCount) +
                                  -0x18) + 0x138);
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,pcVar3,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"_",1);
          pcVar3 = paVar11->name;
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)&local_2e8 +
                            (int)*(undefined8 *)
                                  (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                            super_Texture2DTestCaseParameters.
                                            super_TextureCommonTestCaseParameters.texCoordPrecision,
                                            local_1b0.super_Texture3DTestCaseParameters.
                                            super_Texture2DTestCaseParameters.
                                            super_TextureCommonTestCaseParameters.sampleCount) +
                                  -0x18) + 0x138);
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,pcVar3,sVar4);
          }
          pcVar3 = *(char **)((long)&pTVar7[-1].m_children.
                                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
          if (pcVar3 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"_",1);
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,pcVar3,sVar4);
          }
          local_1c8 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                       *)operator_new(0xc0);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,(char *)local_218[0],&local_2b9);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          local_1f8 = pTVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
          pTVar6 = local_1c8;
          util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
          TextureTestCase(local_1c8,local_2c8,&local_2e8,&local_1e8,(ParameterType *)local_2a8);
          tcu::TestNode::addChild(local_1f0,(TestNode *)pTVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          paVar11 = local_1b8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          pTVar7 = local_1f8;
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
          std::ios_base::~ios_base(local_140);
          if (local_288.
              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_288.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_288.
                                  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_288.
                                  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (CVar2 != COORDTYPE_BASIC) break;
          pTVar8 = (TestNode *)((long)&local_220->_vptr_TestNode + 1);
          pTVar7 = (TestNode *)&pTVar7->m_name;
          bVar14 = local_220 < (TestNode *)0x2;
          local_220 = pTVar8;
        } while (bVar14);
        lVar5 = (long)local_228 + 1;
      } while (lVar5 != 3);
      lVar12 = (long)local_240 + 1;
    } while (lVar12 != 4);
    tcu::TestNode::addChild(local_230,local_1f0);
    lVar12 = (long)local_250 + 1;
    if (lVar12 == 3) {
      lVar12 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_2a8);
        pcStack_260 = (char *)0x0;
        local_268 = COORDTYPE_BASIC_BIAS;
        local_2a8._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_2a8._16_4_ = COORDTYPE_AFFINE;
        local_2a8._20_4_ = COORDTYPE_AFFINE;
        local_2a8._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
        local_270._0_4_ = 0x40;
        local_270._4_4_ = 0x40;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.sampleCount = VK_SAMPLE_COUNT_4_BIT;
        local_2a8._12_4_ = local_2a8._8_4_;
        if (local_288.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_288.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (&local_288,
                     (iterator)
                     local_288.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Program *)&local_1b0);
        }
        else {
          *local_288.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT_BIAS;
          local_288.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_288.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        pcVar3 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)&local_2e8 +
                          (int)*(undefined8 *)
                                (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                          super_Texture2DTestCaseParameters.
                                          super_TextureCommonTestCaseParameters.texCoordPrecision,
                                          local_1b0.super_Texture3DTestCaseParameters.
                                          super_Texture2DTestCaseParameters.
                                          super_TextureCommonTestCaseParameters.sampleCount) + -0x18
                                ) + 0x138);
        }
        else {
          sVar4 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,pcVar3,sVar4);
        }
        pTVar6 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                  *)operator_new(0xc0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,(char *)local_218[0],&local_2b9);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"","");
        util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
        TextureTestCase(pTVar6,local_2c8,&local_2e8,&local_1e8,(ParameterType *)local_2a8);
        tcu::TestNode::addChild(local_238,(TestNode *)pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        std::ios_base::~ios_base(local_140);
        if (local_288.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_288.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_288.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_288.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      lVar12 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = 0;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_2a8._0_4_ = 0;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (&local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.programs,
                     (iterator)
                     local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                     super_TextureCommonTestCaseParameters.programs.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12
                             ),(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67478;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,
               &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_1c0,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      lVar12 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = 0;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_2a8._0_4_ = 0;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (&local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.programs,
                     (iterator)
                     local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                     super_TextureCommonTestCaseParameters.programs.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12
                             ),(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67568;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,
               &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_2b8,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      lVar12 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        pcVar3 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = (CoordType)pcVar3;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = SUB84((ulong)pcVar3 >> 0x20,0)
        ;
        local_2a8._0_4_ = 0;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (&local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.programs,
                     (iterator)
                     local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                     super_TextureCommonTestCaseParameters.programs.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,pcVar3,(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67610;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,
               &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_2b0,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      lVar12 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        pcVar3 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = (CoordType)pcVar3;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = SUB84((ulong)pcVar3 >> 0x20,0)
        ;
        local_2a8._0_4_ = 0;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (&local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.programs,
                     (iterator)
                     local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                     super_TextureCommonTestCaseParameters.programs.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,pcVar3,(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d676b8;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,
               &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_248,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pTVar8 = local_1c0;
        pTVar7 = local_230;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      tcu::TestNode::addChild(local_230,local_238);
      tcu::TestNode::addChild(pTVar7,pTVar8);
      pTVar8 = local_2b8;
      local_2b8 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      pTVar8 = local_2b0;
      local_2b8 = (TestNode *)0x0;
      local_2b0 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      pTVar8 = local_248;
      local_2b0 = (TestNode *)0x0;
      local_248 = (TestNode *)0x0;
      local_2b8 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      local_248 = (TestNode *)0x0;
      local_2b0 = (TestNode *)0x0;
      local_2b8 = (TestNode *)0x0;
      tcu::TestNode::addChild(local_38,pTVar7);
      local_250 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_250,local_2c8,"cubemap","Cube Mipmap Filtering");
      local_2b8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2b8,local_2c8,"min_lod","Lod control: min lod");
      local_2b0 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2b0,local_2c8,"max_lod","Lod control: max lod");
      local_228 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_228,local_2c8,"base_level","Base level");
      local_240 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_240,local_2c8,"max_level","Max level");
      pTVar7 = (TestNode *)0x0;
      do {
        local_220 = (TestNode *)operator_new(0x70);
        local_1f0 = pTVar7;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_220,local_2c8,
                   populateTextureMipmappingTests::cubeCoordTypes[(long)pTVar7].name,
                   populateTextureMipmappingTests::cubeCoordTypes[(long)pTVar7].desc);
        local_1c8 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                     *)(populateTextureMipmappingTests::cubeCoordTypes + (long)pTVar7);
        paVar11 = (anon_struct_16_2_3f8b7511 *)0x0;
        do {
          pTVar7 = (TestNode *)0x0;
          local_1b8 = paVar11;
          do {
            lVar12 = 8;
            local_1f8 = pTVar7;
            do {
              util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                        ((TextureCubeTestCaseParameters *)local_2a8);
              local_268 = *(CoordType *)
                           &(local_1c8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode
              ;
              local_2a8._8_4_ = populateTextureMipmappingTests::minFilterModes[(long)paVar11].mode;
              local_2a8._12_4_ = populateTextureMipmappingTests::magFilterModes[(long)pTVar7].mode;
              pcVar3 = populateTextureMipmappingTests::minFilterModes[(long)paVar11].name;
              local_2a8._16_4_ =
                   *(CoordType *)((long)&populateTextureMipmappingTests::wrapModes[0].name + lVar12)
              ;
              local_2a8._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
              local_270._0_4_ = 0x40;
              local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
              super_TextureCommonTestCaseParameters.sampleCount = VK_SAMPLE_COUNT_16_BIT;
              local_2a8._20_4_ = local_2a8._16_4_;
              pcStack_260 = pcVar3;
              if (local_288.
                  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_288.
                  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
                _M_realloc_insert<vkt::texture::util::Program>
                          (&local_288,
                           (iterator)
                           local_288.
                           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Program *)&local_1b0);
              }
              else {
                *local_288.
                 super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                 ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_CUBE_FLOAT;
                local_288.
                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_288.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
              super_TextureCommonTestCaseParameters.sampleCount =
                   VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_4_BIT;
              if (local_288.
                  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_288.
                  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
                _M_realloc_insert<vkt::texture::util::Program>
                          (&local_288,
                           (iterator)
                           local_288.
                           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Program *)&local_1b0);
              }
              else {
                *local_288.
                 super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                 ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_CUBE_FLOAT_BIAS;
                local_288.
                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_288.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              if (pcVar3 == (char *)0x0) {
                std::ios::clear((int)&local_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.
                                                texCoordPrecision,
                                                local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.sampleCount) +
                                      -0x18) + 0x138);
              }
              else {
                sVar4 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0,pcVar3,sVar4);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"_",1);
              pcVar3 = populateTextureMipmappingTests::magFilterModes[(long)pTVar7].name;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear((int)&local_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.
                                                texCoordPrecision,
                                                local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.sampleCount) +
                                      -0x18) + 0x138);
              }
              else {
                sVar4 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0,pcVar3,sVar4);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"_",1);
              pcVar3 = *(char **)((long)&PTR_typeinfo_00d67238 + lVar12);
              if (pcVar3 == (char *)0x0) {
                std::ios::clear((int)&local_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.
                                                texCoordPrecision,
                                                local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.sampleCount) +
                                      -0x18) + 0x138);
              }
              else {
                sVar4 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0,pcVar3,sVar4);
              }
              pTVar8 = (TestNode *)operator_new(0xc0);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2e8,(char *)local_218[0],&local_2b9);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar8,local_2c8,local_2e8._M_dataplus._M_p,
                         local_1e8._M_dataplus._M_p);
              pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67760;
              pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
              pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_2a8._12_4_,local_2a8._8_4_);
              *(ulong *)((long)&pTVar8[1].m_testCtx + 4) =
                   CONCAT44(local_2a8._16_4_,local_2a8._12_4_);
              *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
                   CONCAT44(local_2a8._24_4_,local_2a8._20_4_);
              std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ::vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                        *)&pTVar8[1].m_name.field_2,&local_288);
              *(int *)&pTVar8[1].m_description._M_string_length = (int)local_270;
              pTVar8[1].m_description.field_2._M_allocated_capacity = CONCAT44(iStack_264,local_268)
              ;
              *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_260;
              tcu::TestNode::addChild(local_220,pTVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p,
                                local_2e8.field_2._M_allocated_capacity + 1);
              }
              if (local_218[0] != local_208) {
                operator_delete(local_218[0],local_208[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
              std::ios_base::~ios_base(local_140);
              if (local_288.
                  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_288.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_288.
                                      super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_288.
                                      super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar12 = lVar12 + 0x10;
            } while (lVar12 != 0x38);
            pTVar7 = (TestNode *)((long)&local_1f8->_vptr_TestNode + 1);
          } while (local_1f8 == (TestNode *)0x0);
          paVar11 = (anon_struct_16_2_3f8b7511 *)((long)&local_1b8->name + 1);
        } while (paVar11 != (anon_struct_16_2_3f8b7511 *)0x4);
        tcu::TestNode::addChild(local_250,local_220);
        pTVar7 = (TestNode *)((long)&local_1f0->_vptr_TestNode + 1);
      } while (pTVar7 != (TestNode *)0x3);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = 0;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_2a8._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_CUBE_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12
                             ),(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67800;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        *(int *)&pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_2b8,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = 0;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_2a8._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_CUBE_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12
                             ),(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d678f0;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        *(int *)&pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_2b0,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        pcVar3 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = (CoordType)pcVar3;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = SUB84((ulong)pcVar3 >> 0x20,0)
        ;
        local_2a8._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_CUBE_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,pcVar3,(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67998;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        *(int *)&pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_228,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)&local_1b0);
        local_1b0.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_EDGE;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        pcVar3 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = (CoordType)pcVar3;
        local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_ = SUB84((ulong)pcVar3 >> 0x20,0)
        ;
        local_2a8._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_CUBE_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,pcVar3,(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67a40;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        *(int *)&pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        tcu::TestNode::addChild(local_240,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pTVar8 = local_250;
        pTVar7 = local_2b0;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      tcu::TestNode::addChild(local_250,local_2b8);
      tcu::TestNode::addChild(pTVar8,pTVar7);
      pTVar7 = local_228;
      local_228 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar8,pTVar7);
      pTVar7 = local_240;
      local_228 = (TestNode *)0x0;
      local_240 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar8,pTVar7);
      local_240 = (TestNode *)0x0;
      local_228 = (TestNode *)0x0;
      tcu::TestNode::addChild(local_38,pTVar8);
      local_248 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_248,local_2c8,"3d","3D Mipmap Filtering");
      local_230 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_230,local_2c8,"bias","User-supplied bias value");
      local_238 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_238,local_2c8,"min_lod","Lod control: min lod");
      local_250 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_250,local_2c8,"max_lod","Lod control: max lod");
      local_2b8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2b8,local_2c8,"base_level","Base level");
      local_2b0 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2b0,local_2c8,"max_level","Max level");
      local_240 = (TestNode *)0x0;
      do {
        local_1f8 = (TestNode *)operator_new(0x70);
        pTVar7 = local_240;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_1f8,local_2c8,
                   populateTextureMipmappingTests::coordTypes[(long)local_240].name,
                   populateTextureMipmappingTests::coordTypes[(long)local_240].desc);
        local_1c8 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                     *)CONCAT44(local_1c8._4_4_,
                                populateTextureMipmappingTests::coordTypes[(long)pTVar7].type);
        lVar12 = 0;
        do {
          local_1f0 = (TestNode *)(populateTextureMipmappingTests::minFilterModes + lVar12);
          paVar11 = (anon_struct_16_2_3f8b7511 *)0x0;
          local_228 = (TestNode *)lVar12;
          do {
            util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                      ((Texture3DTestCaseParameters *)local_2a8);
            pcStack_260 = (char *)CONCAT44(pcStack_260._4_4_,(int)local_1c8);
            local_2a8._8_4_ = *(undefined4 *)&local_1f0->m_testCtx;
            __s = local_1f0->_vptr_TestNode;
            local_220 = (TestNode *)((long)paVar11 * 0x10);
            local_2a8._16_4_ = populateTextureMipmappingTests::wrapModes[(long)paVar11].mode;
            local_2a8._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.sampleCount = VK_SAMPLE_COUNT_32_BIT;
            local_2a8._20_4_ = local_2a8._16_4_;
            local_268 = local_2a8._16_4_;
            local_258 = __s;
            local_1b8 = paVar11;
            if (local_288.
                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_288.
                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ::_M_realloc_insert<vkt::texture::util::Program>
                        (&local_288,
                         (iterator)
                         local_288.
                         super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(Program *)&local_1b0);
            }
            else {
              *local_288.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_3D_FLOAT;
              local_288.
              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_288.
                   super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_220 = (TestNode *)
                        ((long)&populateTextureMipmappingTests::wrapModes[0].name + (long)local_220)
            ;
            piVar13 = &populateTextureMipmappingTests::tex3DSizes[0].depth;
            iVar10 = 0;
            do {
              local_270 = *(undefined8 *)(piVar13 + -2);
              iStack_264 = *piVar13;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              if (__s == (_func_int **)0x0) {
                std::ios::clear((int)&local_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.
                                                texCoordPrecision,
                                                local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.sampleCount) +
                                      -0x18) + 0x138);
              }
              else {
                sVar4 = strlen((char *)__s);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0,(char *)__s,sVar4);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"_",1);
              __s_00 = local_220->_vptr_TestNode;
              if (__s_00 == (_func_int **)0x0) {
                std::ios::clear((int)&local_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.
                                                texCoordPrecision,
                                                local_1b0.super_Texture3DTestCaseParameters.
                                                super_Texture2DTestCaseParameters.
                                                super_TextureCommonTestCaseParameters.sampleCount) +
                                      -0x18) + 0x138);
              }
              else {
                sVar4 = strlen((char *)__s_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0,(char *)__s_00,sVar4);
              }
              pcVar3 = ((anon_struct_24_4_abf30936 *)(piVar13 + -4))->name;
              if (pcVar3 != (char *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"_",1);
                sVar4 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0,pcVar3,sVar4);
              }
              pTVar9 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>
                        *)operator_new(200);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2e8,(char *)local_218[0],&local_2b9);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
              util::
              TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
              TextureTestCase(pTVar9,local_2c8,&local_2e8,&local_1e8,(ParameterType *)local_2a8);
              tcu::TestNode::addChild(local_1f8,(TestNode *)pTVar9);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p,
                                local_2e8.field_2._M_allocated_capacity + 1);
              }
              if (local_218[0] != local_208) {
                operator_delete(local_218[0],local_208[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
              std::ios_base::~ios_base(local_140);
              piVar13 = piVar13 + 6;
              bVar14 = iVar10 == 0;
              iVar10 = iVar10 + 1;
            } while (bVar14 && (int)local_1c8 == 0);
            if (local_288.
                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_288.
                              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_288.
                                    super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_288.
                                    super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            paVar11 = (anon_struct_16_2_3f8b7511 *)((long)&local_1b8->name + 1);
          } while (paVar11 != (anon_struct_16_2_3f8b7511 *)0x3);
          lVar12 = (long)local_228 + 1;
        } while (lVar12 != 4);
        tcu::TestNode::addChild(local_248,local_1f8);
        local_240 = (TestNode *)((long)local_240 + 1);
      } while (local_240 != (TestNode *)0x3);
      lVar12 = 0;
      local_240 = (TestNode *)0x3;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  (&local_1b0.super_Texture3DTestCaseParameters);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName = (char *)0x0;
        local_1b0.super_Texture3DTestCaseParameters.depth = 0x20;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC_BIAS;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_1b0.super_Texture3DTestCaseParameters.wrapR = REPEAT_GL;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.wrapS = REPEAT_GL;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.wrapT = REPEAT_GL;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.format = VK_FORMAT_R8G8B8A8_UNORM;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width = 0x20;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.height = 0x20;
        local_2a8._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (&local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.programs,
                     (iterator)
                     local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                     super_TextureCommonTestCaseParameters.programs.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_3D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_2a8._0_4_ = VK_SAMPLE_COUNT_32_BIT|VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (&local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.programs,
                     (iterator)
                     local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                     super_TextureCommonTestCaseParameters.programs.
                     super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_3D_FLOAT_BIAS;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar9 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>
                  *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12
                             ),(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
        TextureTestCase(pTVar9,local_2c8,(string *)local_2a8,&local_2e8,&local_1b0);
        tcu::TestNode::addChild(local_230,(TestNode *)pTVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  (&local_1b0.super_Texture3DTestCaseParameters);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName = (char *)0x0;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_2a8._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_3D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12
                             ),(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67b88;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        *(char **)&pTVar7[1].m_nodeType =
             local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName;
        tcu::TestNode::addChild(local_238,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  (&local_1b0.super_Texture3DTestCaseParameters);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName = (char *)0x0;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        local_2a8._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_3D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12
                             ),(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67c78;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        *(char **)&pTVar7[1].m_nodeType =
             local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName;
        tcu::TestNode::addChild(local_250,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  (&local_1b0.super_Texture3DTestCaseParameters);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        pcVar3 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12);
        local_2a8._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName = pcVar3;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_3D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,pcVar3,(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67d20;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        *(char **)&pTVar7[1].m_nodeType =
             local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName;
        tcu::TestNode::addChild(local_2b8,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pvVar1 = &local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs;
      lVar12 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  (&local_1b0.super_Texture3DTestCaseParameters);
        local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC;
        local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar12)
        ;
        pcVar3 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar12);
        local_2a8._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName = pcVar3;
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    (pvVar1,(iterator)
                            local_1b0.super_Texture3DTestCaseParameters.
                            super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                            programs.
                            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Program *)local_2a8);
        }
        else {
          *local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_3D_FLOAT;
          local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.programs.
               super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pTVar7 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,pcVar3,(allocator<char> *)local_218);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_2c8,(char *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                   local_2e8._M_dataplus._M_p);
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d67dc8;
        pTVar7[1]._vptr_TestNode =
             (_func_int **)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.texCoordPrecision,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.sampleCount);
        pTVar7[1].m_testCtx =
             (TestContext *)
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter);
        *(ulong *)((long)&pTVar7[1].m_testCtx + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
        *(ulong *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,
                      local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar7[1].m_name.field_2,pvVar1);
        pTVar7[1].m_description._M_string_length =
             local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters._56_8_;
        pTVar7[1].m_description.field_2._M_allocated_capacity =
             CONCAT44(local_1b0.super_Texture3DTestCaseParameters.depth,
                      local_1b0.super_Texture3DTestCaseParameters.wrapR);
        *(ulong *)((long)&pTVar7[1].m_description.field_2 + 8) =
             CONCAT44(local_1b0.super_TextureMipmapCommonTestCaseParameters._4_4_,
                      local_1b0.super_TextureMipmapCommonTestCaseParameters.coordType);
        *(char **)&pTVar7[1].m_nodeType =
             local_1b0.super_TextureMipmapCommonTestCaseParameters.minFilterName;
        tcu::TestNode::addChild(local_2b0,pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != local_2a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                          CONCAT44(local_2a8._20_4_,local_2a8._16_4_) + 1);
        }
        if (local_1b0.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
            super_TextureCommonTestCaseParameters.programs.
            super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.super_Texture3DTestCaseParameters.
                          super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                          programs.
                          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.super_Texture3DTestCaseParameters.
                                super_Texture2DTestCaseParameters.
                                super_TextureCommonTestCaseParameters.programs.
                                super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pTVar8 = local_238;
        pTVar7 = local_248;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      tcu::TestNode::addChild(local_248,local_230);
      tcu::TestNode::addChild(pTVar7,pTVar8);
      pTVar8 = local_250;
      local_250 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      pTVar8 = local_2b8;
      local_250 = (TestNode *)0x0;
      local_2b8 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      pTVar8 = local_2b0;
      local_250 = (TestNode *)0x0;
      local_2b8 = (TestNode *)0x0;
      local_2b0 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      local_250 = (TestNode *)0x0;
      local_2b8 = (TestNode *)0x0;
      local_2b0 = (TestNode *)0x0;
      tcu::TestNode::addChild(local_38,pTVar7);
      return;
    }
  } while( true );
}

Assistant:

void populateTextureMipmappingTests (tcu::TestCaseGroup* textureMipmappingTests)
{
	tcu::TestContext&	testCtx		= textureMipmappingTests->getTestContext();

	static const struct
	{
		const char*				name;
		const Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp",		Sampler::CLAMP_TO_EDGE		},
		{ "repeat",		Sampler::REPEAT_GL			},
		{ "mirror",		Sampler::MIRRORED_REPEAT_GL	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	Sampler::NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		Sampler::LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		Sampler::NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		Sampler::LINEAR_MIPMAP_LINEAR	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} magFilterModes[] =
	{
		{ "nearest",	Sampler::NEAREST},
		{ "linear",		Sampler::LINEAR}
	};


	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
		const int		depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2D				(new tcu::TestCaseGroup(testCtx, "2d", "2D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup2D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup2D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup2D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup2D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup2D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup		(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add non_square variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

					for (int size = 0; size < sizeEnd; size++)
					{
						Texture2DMipmapTestCaseParameters	testParameters;

						testParameters.coordType	= coordTypes[coordType].type;
						testParameters.minFilter	= minFilterModes[minFilter].mode;
						testParameters.wrapS		= wrapModes[wrapMode].mode;
						testParameters.wrapT		= wrapModes[wrapMode].mode;
						testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
						testParameters.width		= tex2DSizes[size].width;
						testParameters.height		= tex2DSizes[size].height;
						testParameters.programs.push_back(PROGRAM_2D_FLOAT);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex2DSizes[size].name)
							name << "_" << tex2DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group2D->addChild(coordTypeGroup.release());
		}

		// 2D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;

				testParameters.coordType	= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.magFilter	= minFilterModes[minFilter].mode;
				testParameters.wrapS		= Sampler::REPEAT_GL;
				testParameters.wrapT		= Sampler::REPEAT_GL;
				testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
				testParameters.width		= tex2DSizes[0].width;
				testParameters.height		= tex2DSizes[0].height;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT_BIAS);

				std::ostringstream name;
				name << minFilterModes[minFilter].name;

				biasGroup2D->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
			}
		}

		// 2D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				minLodGroup2D->addChild(new TextureTestCase<Texture2DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLodGroup2D->addChild(new TextureTestCase<Texture2DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				baseLevelGroup2D->addChild(new TextureTestCase<Texture2DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLevelGroup2D->addChild(new TextureTestCase<Texture2DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group2D->addChild(biasGroup2D.release());
		group2D->addChild(minLodGroup2D.release());
		group2D->addChild(maxLodGroup2D.release());
		group2D->addChild(baseLevelGroup2D.release());
		group2D->addChild(maxLevelGroup2D.release());

		textureMipmappingTests->addChild(group2D.release());
	}

	// Cubemap cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	groupCube			(new tcu::TestCaseGroup(testCtx, "cubemap", "Cube Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	minLodGroupCube		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroupCube		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int magFilter = 0; magFilter < DE_LENGTH_OF_ARRAY(magFilterModes); magFilter++)
				{
					for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
					{
						TextureCubeMipmapTestCaseParameters	testParameters;

						testParameters.coordType		= cubeCoordTypes[coordType].type;
						testParameters.minFilter		= minFilterModes[minFilter].mode;
						testParameters.magFilter		= magFilterModes[magFilter].mode;
						testParameters.minFilterName	= minFilterModes[minFilter].name;
						testParameters.wrapS			= wrapModes[wrapMode].mode;
						testParameters.wrapT			= wrapModes[wrapMode].mode;
						testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
						testParameters.size				= cubeMapSize;
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT_BIAS);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << magFilterModes[magFilter].name
							 << "_" << wrapModes[wrapMode].name;

						coordTypeGroup->addChild(new TextureTestCase<TextureCubeMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			groupCube->addChild(coordTypeGroup.release());
		}

		// Cubemap LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				minLodGroupCube->addChild(new TextureTestCase<TextureCubeMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLodGroupCube->addChild(new TextureTestCase<TextureCubeMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				baseLevelGroupCube->addChild(new TextureTestCase<TextureCubeBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLevelGroupCube->addChild(new TextureTestCase<TextureCubeMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		groupCube->addChild(minLodGroupCube.release());
		groupCube->addChild(maxLodGroupCube.release());
		groupCube->addChild(baseLevelGroupCube.release());
		groupCube->addChild(maxLevelGroupCube.release());

		textureMipmappingTests->addChild(groupCube.release());
	}

	// 3D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group3D				(new tcu::TestCaseGroup(testCtx, "3d", "3D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup3D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup3D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup3D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup3D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup3D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add other size variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

					Texture3DMipmapTestCaseParameters	testParameters;

					testParameters.coordType		= coordTypes[coordType].type;
					testParameters.minFilter		= minFilterModes[minFilter].mode;
					testParameters.minFilterName	= minFilterModes[minFilter].name;
					testParameters.wrapR			= wrapModes[wrapMode].mode;
					testParameters.wrapS			= wrapModes[wrapMode].mode;
					testParameters.wrapT			= wrapModes[wrapMode].mode;
					testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
					testParameters.programs.push_back(PROGRAM_3D_FLOAT);

					for (int size = 0; size < sizeEnd; size++)
					{
						testParameters.width			= tex3DSizes[size].width;
						testParameters.height			= tex3DSizes[size].height;
						testParameters.depth			= tex3DSizes[size].depth;

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex3DSizes[size].name)
							name << "_" << tex3DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group3D->addChild(coordTypeGroup.release());
		}

		// 3D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.coordType			= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.wrapR				= Sampler::REPEAT_GL;
				testParameters.wrapS				= Sampler::REPEAT_GL;
				testParameters.wrapT				= Sampler::REPEAT_GL;
				testParameters.format				= VK_FORMAT_R8G8B8A8_UNORM;
				testParameters.width				= tex3DSizes[0].width;
				testParameters.height				= tex3DSizes[0].height;
				testParameters.depth				= tex3DSizes[0].depth;

				testParameters.programs.push_back(PROGRAM_3D_FLOAT);
				testParameters.programs.push_back(PROGRAM_3D_FLOAT_BIAS);

				biasGroup3D->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		// 3D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				minLodGroup3D->addChild(new TextureTestCase<Texture3DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLodGroup3D->addChild(new TextureTestCase<Texture3DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				baseLevelGroup3D->addChild(new TextureTestCase<Texture3DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLevelGroup3D->addChild(new TextureTestCase<Texture3DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group3D->addChild(biasGroup3D.release());
		group3D->addChild(minLodGroup3D.release());
		group3D->addChild(maxLodGroup3D.release());
		group3D->addChild(baseLevelGroup3D.release());
		group3D->addChild(maxLevelGroup3D.release());

		textureMipmappingTests->addChild(group3D.release());
	}
}